

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copper.cpp
# Opt level: O1

bool __thiscall Amiga::Copper::advance_dma(Copper *this,uint16_t position,uint16_t blitter_status)

{
  ushort uVar1;
  uint uVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  bool bVar6;
  State SVar7;
  bool bVar8;
  
  SVar7 = this->state_;
  if (SVar7 == FetchFirstWord) {
    this->instruction_[0] =
         (this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_
         [(this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_mask_ & this->address_];
    this->address_ = this->address_ + 1;
    bVar6 = true;
    SVar7 = FetchSecondWord;
  }
  else {
    bVar3 = (byte)(blitter_status >> 8);
    if (SVar7 == FetchSecondWord) {
      bVar8 = this->skip_next_;
      this->skip_next_ = false;
      uVar2 = this->address_;
      uVar4 = (this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_
              [(this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.ram_mask_ & uVar2];
      this->instruction_[1] = uVar4;
      this->address_ = uVar2 + 1;
      uVar1 = this->instruction_[0];
      bVar6 = true;
      if ((uVar1 & 1) == 0) {
        SVar7 = FetchFirstWord;
        if (bVar8 == false) {
          uVar5 = (ushort)(uVar1 & 0x1fe);
          this->instruction_[0] = uVar5;
          if ((uVar5 < 0x10) || ((uVar5 < 0x20 && ((this->control_ & 1) == 0)))) {
            SVar7 = Stopped;
          }
          else {
            Chipset::write((this->super_DMADevice<2UL,_0UL>).super_DMADeviceBase.chipset_,
                           uVar1 & 0x1fe,(void *)(ulong)uVar4,1);
          }
        }
      }
      else {
        SVar7 = Waiting;
        if ((uVar4 & 1) != 0) {
          SVar7 = FetchFirstWord;
          bVar8 = false;
          if ((bVar3 >> 6 & -1 < (short)this->instruction_[1]) == 0) {
            uVar4 = this->instruction_[1] & 0x7ffe | 0x8000;
            bVar8 = (uVar4 & uVar1) <= (position & uVar4);
          }
          this->skip_next_ = bVar8;
        }
      }
    }
    else {
      if (SVar7 != Waiting) {
        return false;
      }
      SVar7 = FetchFirstWord;
      bVar6 = false;
      if ((bVar3 >> 6 & -1 < (short)this->instruction_[1]) != 0) {
        return false;
      }
      uVar4 = this->instruction_[1] & 0x7ffe | 0x8000;
      if ((position & uVar4) < (this->instruction_[0] & uVar4)) {
        return false;
      }
    }
  }
  this->state_ = SVar7;
  return bVar6;
}

Assistant:

bool Copper::advance_dma(uint16_t position, uint16_t blitter_status) {
	switch(state_) {
		default: return false;

		case State::Waiting:
			if(satisfies_raster(position, blitter_status, instruction_)) {
				logger.info().append("Unblocked waiting for %04x at %04x with mask %04x", instruction_[0], position, instruction_[1] & 0x7ffe);
				state_ = State::FetchFirstWord;
			}
		return false;

		case State::FetchFirstWord:
			instruction_[0] = ram_[address_ & ram_mask_];
			++address_;
			state_ = State::FetchSecondWord;
			logger.info().append("First word fetch at %04x", position);
		break;

		case State::FetchSecondWord: {
			// Get and reset the should-skip-next flag.
			const bool should_skip_move = skip_next_;
			skip_next_ = false;

			// Read in the second instruction word.
			instruction_[1] = ram_[address_ & ram_mask_];
			++address_;
			logger.info().append("Second word fetch at %04x", position);

			// Check for a MOVE.
			if(!(instruction_[0] & 1)) {
				if(!should_skip_move) {
					// Stop if this move would be a privilege violation.
					instruction_[0] &= 0x1fe;
					if((instruction_[0] < 0x10) || (instruction_[0] < 0x20 && !(control_&1))) {
						logger.info().append("Invalid MOVE to %04x; stopping", instruction_[0]);
						state_ = State::Stopped;
						break;
					}

					chipset_.write(instruction_[0], instruction_[1]);
				}

				// Roll onto the next command.
				state_ = State::FetchFirstWord;
				break;
			}

			// Got to here => this is a WAIT or a SKIP.

			if(!(instruction_[1] & 1)) {
				// A WAIT. The wait-for-start-of-next PAL wait of
				// $FFDF,$FFFE seems to suggest evaluation will happen
				// in the next cycle rather than this one.
				state_ = State::Waiting;
				break;
			}

			// Neither a WAIT nor a MOVE => a SKIP.

			skip_next_ = satisfies_raster(position, blitter_status, instruction_);
			state_ = State::FetchFirstWord;
		} break;
	}

	return true;
}